

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too)

{
  int iVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  option *poVar5;
  int iVar6;
  size_t __n;
  int iVar7;
  char *__s2;
  bool bVar8;
  
  __s = place;
  iVar1 = optind;
  optind = optind + 1;
  pcVar3 = strchr(place,0x3d);
  if (pcVar3 == (char *)0x0) {
    __n = strlen(__s);
    pcVar3 = (char *)0x0;
  }
  else {
    __n = (long)pcVar3 - (long)__s;
    pcVar3 = pcVar3 + 1;
  }
  __s2 = long_options->name;
  if (__s2 != (char *)0x0) {
    poVar5 = long_options + 1;
    iVar7 = -1;
    iVar6 = 0;
    do {
      iVar2 = strncmp(__s,__s2,__n);
      if (iVar2 == 0) {
        sVar4 = strlen(__s2);
        if (sVar4 == __n) goto LAB_00108723;
        if ((__n != 1 || short_too == 0) && (bVar8 = iVar7 != -1, iVar7 = iVar6, bVar8)) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("ambiguous option -- %.*s",__n & 0xffffffff,__s);
          }
          goto LAB_001087cf;
        }
      }
      __s2 = poVar5->name;
      iVar6 = iVar6 + 1;
      poVar5 = poVar5 + 1;
    } while (__s2 != (char *)0x0);
    iVar6 = iVar7;
    if (iVar7 != -1) {
LAB_00108723:
      iVar7 = long_options[iVar6].has_arg;
      if (pcVar3 != (char *)0x0 && iVar7 == 0) {
        if ((opterr != 0) && (*options != ':')) {
          warnx("option doesn\'t take an argument -- %.*s",__n & 0xffffffff,__s);
        }
        optopt = 0;
        if (long_options[iVar6].flag == (int *)0x0) {
          optopt = long_options[iVar6].val;
        }
LAB_0010877a:
        return (uint)(*options != ':') * 5 + 0x3a;
      }
      if (iVar7 - 1U < 2) {
        if (pcVar3 == (char *)0x0) {
          if (iVar7 != 1) goto LAB_0010885a;
          optind = iVar1 + 2;
          iVar7 = long_options[iVar6].has_arg;
          pcVar3 = nargv[(long)iVar1 + 1];
        }
        optarg = pcVar3;
        if ((iVar7 == 1) && (optarg == (char *)0x0)) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("option requires an argument -- %s",__s);
          }
          optopt = 0;
          if (long_options[iVar6].flag == (int *)0x0) {
            optopt = long_options[iVar6].val;
          }
          optind = optind + -1;
          goto LAB_0010877a;
        }
      }
LAB_0010885a:
      if (idx != (int *)0x0) {
        *idx = iVar6;
      }
      if (long_options[iVar6].flag == (int *)0x0) {
        return long_options[iVar6].val;
      }
      *long_options[iVar6].flag = long_options[iVar6].val;
      return 0;
    }
  }
  if (short_too == 0) {
    if ((opterr != 0) && (*options != ':')) {
      warnx("unknown option -- %s",__s);
    }
LAB_001087cf:
    optopt = 0;
    iVar7 = 0x3f;
  }
  else {
    iVar7 = -1;
    optind = iVar1;
  }
  return iVar7;
}

Assistant:

static int
parse_long_options(char * const * nargv, const char * options,
				   const struct option * long_options, int * idx, int short_too) {
	char * current_argv, *has_equal;
	size_t current_argv_len;
	int i, match;

	current_argv = place;
	match = -1;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = has_equal - current_argv;
		has_equal++;
	} else {
		current_argv_len = strlen(current_argv);
	}

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
					current_argv_len)) {
			continue;
		}

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			break;
		}

		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1) {
			continue;
		}

		if (match == -1) {	/* partial match */
			match = i;
		} else {
			/* ambiguous abbreviation */
			if (PRINT_ERROR)
				warnx(ambig, (int)current_argv_len,
					  current_argv);

			optopt = 0;
			return (BADCH);
		}
	}

	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
				&& has_equal) {
			if (PRINT_ERROR)
				warnx(noarg, (int)current_argv_len,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			return (BADARG);
		}

		if (long_options[match].has_arg == required_argument ||
				long_options[match].has_arg == optional_argument) {
			if (has_equal) {
				optarg = has_equal;
			} else if (long_options[match].has_arg ==
					   required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}

		if ((long_options[match].has_arg == required_argument)
				&& (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
					  current_argv);

			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL) {
				optopt = long_options[match].val;
			} else {
				optopt = 0;
			}

			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}

		if (PRINT_ERROR) {
			warnx(illoptstring, current_argv);
		}

		optopt = 0;
		return (BADCH);
	}

	if (idx) {
		*idx = match;
	}

	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else {
		return (long_options[match].val);
	}
}